

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QAction::setData(QAction *this,QVariant *data)

{
  bool bVar1;
  QActionPrivate *rhs;
  QVariant *in_RSI;
  QActionPrivate *in_RDI;
  QActionPrivate *d;
  
  rhs = d_func((QAction *)0x97780c);
  bVar1 = ::operator==(in_RSI,(QVariant *)rhs);
  if (!bVar1) {
    ::QVariant::operator=(&rhs->userData,in_RSI);
    QActionPrivate::sendDataChanged(in_RDI);
  }
  return;
}

Assistant:

void QAction::setData(const QVariant &data)
{
    Q_D(QAction);
    if (d->userData == data)
        return;
    d->userData = data;
    d->sendDataChanged();
}